

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this)

{
  buffer<char> *in_RDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *unaff_retaddr;
  
  in_RDI->_vptr_buffer = (_func_int **)&PTR_grow_00277fd0;
  deallocate(unaff_retaddr);
  internal::buffer<char>::~buffer(in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)in_RDI);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }